

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  UInt16 *pUVar5;
  Byte *pBVar6;
  SizeT SVar7;
  short sVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  UInt16 *pUVar16;
  Byte *pBVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ushort *puVar24;
  byte *pbVar25;
  ulong uVar26;
  uint uVar27;
  UInt32 UVar28;
  byte bVar29;
  uint uVar30;
  uint uVar31;
  SizeT SVar32;
  SizeT SVar33;
  uint uVar34;
  ulong uVar35;
  UInt32 UVar36;
  uint local_dc;
  uint local_d8;
  UInt32 local_d4;
  UInt32 local_d0;
  UInt32 local_cc;
  ulong local_b8;
  ulong local_90;
  
  do {
    uVar4 = p->checkDicSize;
    local_90 = limit;
    if ((uVar4 == 0) &&
       (uVar26 = (ulong)((p->prop).dicSize - p->processedPos), local_90 = p->dicPos + uVar26,
       limit - p->dicPos <= uVar26)) {
      local_90 = limit;
    }
    pUVar5 = p->probs;
    local_b8 = (ulong)p->state;
    local_dc = p->reps[0];
    uVar11 = (p->prop).pb;
    local_d0 = p->reps[1];
    local_d4 = p->reps[2];
    uVar12 = (p->prop).lp;
    local_cc = p->reps[3];
    pBVar6 = p->dic;
    SVar7 = p->dicBufSize;
    SVar33 = p->dicPos;
    UVar36 = p->processedPos;
    pbVar25 = p->buf;
    bVar2 = (byte)(p->prop).lc;
    uVar27 = p->range;
    uVar13 = p->code;
    uVar26 = 0;
LAB_0070e8d7:
    UVar28 = local_cc;
    uVar18 = local_dc;
    if (uVar27 < 0x1000000) {
      uVar27 = uVar27 << 8;
      bVar29 = *pbVar25;
      pbVar25 = pbVar25 + 1;
      uVar13 = (uint)bVar29 | uVar13 << 8;
    }
    uVar14 = UVar36 & ~(-1 << ((byte)uVar11 & 0x1f));
    uVar21 = (ulong)uVar14;
    uVar34 = (uint)local_b8;
    uVar22 = (ulong)(uVar34 << 4);
    uVar3 = pUVar5[uVar22 + uVar21];
    uVar30 = (uVar27 >> 0xb) * (uint)uVar3;
    uVar31 = uVar13 - uVar30;
    if (uVar13 < uVar30) {
      pUVar5[uVar22 + uVar21] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar16 = pUVar5 + 0x736;
      if (UVar36 != 0 || uVar4 != 0) {
        uVar21 = SVar33;
        if (SVar33 == 0) {
          uVar21 = SVar7;
        }
        pUVar16 = pUVar5 + 0x736 +
                  ((uint)(pBVar6[uVar21 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((UVar36 & ~(-1 << ((byte)uVar12 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      if (uVar34 < 7) {
        uVar14 = uVar34 - 3;
        if (uVar34 < 3) {
          uVar14 = 0;
        }
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 * 0x100;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar29 | uVar13 << 8;
        }
        uVar3 = pUVar16[1];
        uVar18 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar27 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          sVar8 = (short)(0x800 - uVar3 >> 5);
          uVar31 = 2;
          uVar27 = uVar13;
        }
        else {
          uVar18 = uVar30 - uVar18;
          sVar8 = -(uVar3 >> 5);
          uVar31 = 3;
        }
        pUVar16[1] = sVar8 + uVar3;
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar27 = (uint)bVar29 | uVar27 << 8;
        }
        uVar3 = pUVar16[uVar31];
        uVar30 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar13 = uVar31 * 2;
        uVar34 = uVar27 - uVar30;
        if (uVar27 < uVar30) {
          pUVar16[uVar31] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar34 = uVar27;
        }
        else {
          uVar30 = uVar18 - uVar30;
          pUVar16[uVar31] = uVar3 - (uVar3 >> 5);
          uVar13 = uVar13 | 1;
        }
        uVar3 = pUVar16[uVar13];
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar34 = (uint)bVar29 | uVar34 << 8;
        }
        uVar31 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar27 = uVar13 * 2;
        uVar18 = uVar34 - uVar31;
        if (uVar34 < uVar31) {
          pUVar16[uVar13] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar18 = uVar34;
        }
        else {
          uVar31 = uVar30 - uVar31;
          pUVar16[uVar13] = uVar3 - (uVar3 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar3 = pUVar16[uVar27];
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar30 = (uVar31 >> 0xb) * (uint)uVar3;
        uVar13 = uVar27 * 2;
        uVar34 = uVar18 - uVar30;
        if (uVar18 < uVar30) {
          pUVar16[uVar27] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar34 = uVar18;
        }
        else {
          uVar30 = uVar31 - uVar30;
          pUVar16[uVar27] = uVar3 - (uVar3 >> 5);
          uVar13 = uVar13 | 1;
        }
        uVar3 = pUVar16[uVar13];
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar34 = (uint)bVar29 | uVar34 << 8;
        }
        uVar31 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar27 = uVar13 * 2;
        uVar18 = uVar34 - uVar31;
        if (uVar34 < uVar31) {
          pUVar16[uVar13] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar18 = uVar34;
        }
        else {
          uVar31 = uVar30 - uVar31;
          pUVar16[uVar13] = uVar3 - (uVar3 >> 5);
          uVar27 = uVar27 | 1;
        }
        uVar3 = pUVar16[uVar27];
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar30 = (uVar31 >> 0xb) * (uint)uVar3;
        uVar13 = uVar27 * 2;
        uVar34 = uVar18 - uVar30;
        if (uVar18 < uVar30) {
          pUVar16[uVar27] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar34 = uVar18;
        }
        else {
          uVar30 = uVar31 - uVar30;
          pUVar16[uVar27] = uVar3 - (uVar3 >> 5);
          uVar13 = uVar13 | 1;
        }
        uVar3 = pUVar16[uVar13];
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar34 = (uint)bVar29 | uVar34 << 8;
        }
        uVar19 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar18 = uVar13 * 2;
        uVar31 = uVar34 - uVar19;
        if (uVar34 < uVar19) {
          pUVar16[uVar13] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar31 = uVar34;
        }
        else {
          uVar19 = uVar30 - uVar19;
          pUVar16[uVar13] = uVar3 - (uVar3 >> 5);
          uVar18 = uVar18 | 1;
        }
        uVar3 = pUVar16[uVar18];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar31 = (uint)bVar29 | uVar31 << 8;
        }
        uVar27 = (uVar19 >> 0xb) * (uint)uVar3;
        bVar29 = (char)uVar18 * '\x02';
        uVar13 = uVar31 - uVar27;
        if (uVar31 < uVar27) {
          pUVar16[uVar18] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar31;
        }
        else {
          uVar27 = uVar19 - uVar27;
          pUVar16[uVar18] = uVar3 - (uVar3 >> 5);
          bVar29 = bVar29 | 1;
        }
      }
      else {
        SVar32 = 0;
        if (SVar33 < local_dc) {
          SVar32 = SVar7;
        }
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 * 0x100;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar29 | uVar13 << 8;
        }
        bVar29 = pBVar6[SVar32 + (SVar33 - local_dc)];
        uVar14 = (uint)bVar29;
        uVar31 = (uint)bVar29 + (uint)bVar29 & 0x100;
        uVar21 = (ulong)uVar31;
        uVar3 = pUVar16[uVar21 + 0x101];
        uVar18 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar27 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          pUVar16[uVar21 + 0x101] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar21 = (ulong)(uVar31 ^ 0x100);
          uVar31 = 2;
          uVar27 = uVar13;
        }
        else {
          uVar18 = uVar30 - uVar18;
          pUVar16[uVar21 + 0x101] = uVar3 - (uVar3 >> 5);
          uVar31 = 3;
        }
        uVar13 = (uint)bVar29 * 4 & (uint)uVar21;
        uVar22 = (ulong)uVar13;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar21 + uVar22 + uVar35];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar1 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar27 = (uint)bVar1 | uVar27 << 8;
        }
        uVar19 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar30 = uVar27 - uVar19;
        if (uVar27 < uVar19) {
          pUVar16[uVar21 + uVar22 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar22 = (ulong)(uVar13 ^ (uint)uVar21);
          uVar30 = uVar27;
        }
        else {
          uVar19 = uVar18 - uVar19;
          pUVar16[uVar21 + uVar22 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar27 = (uint)bVar29 * 8 & (uint)uVar22;
        uVar21 = (ulong)uVar27;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar22 + uVar21 + uVar35];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar1 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar30 = (uint)bVar1 | uVar30 << 8;
        }
        uVar18 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar13 = uVar30 - uVar18;
        if (uVar30 < uVar18) {
          pUVar16[uVar22 + uVar21 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar21 = (ulong)(uVar27 ^ (uint)uVar22);
          uVar13 = uVar30;
        }
        else {
          uVar18 = uVar19 - uVar18;
          pUVar16[uVar22 + uVar21 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar27 = uVar14 << 4 & (uint)uVar21;
        uVar22 = (ulong)uVar27;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar21 + uVar22 + uVar35];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar1 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar1 | uVar13 << 8;
        }
        uVar19 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar30 = uVar13 - uVar19;
        if (uVar13 < uVar19) {
          pUVar16[uVar21 + uVar22 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar22 = (ulong)(uVar27 ^ (uint)uVar21);
          uVar30 = uVar13;
        }
        else {
          uVar19 = uVar18 - uVar19;
          pUVar16[uVar21 + uVar22 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar27 = (uint)bVar29 << 5 & (uint)uVar22;
        uVar21 = (ulong)uVar27;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar22 + uVar21 + uVar35];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar30 = (uint)bVar29 | uVar30 << 8;
        }
        uVar18 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar13 = uVar30 - uVar18;
        if (uVar30 < uVar18) {
          pUVar16[uVar22 + uVar21 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar21 = (ulong)(uVar27 ^ (uint)uVar22);
          uVar13 = uVar30;
        }
        else {
          uVar18 = uVar19 - uVar18;
          pUVar16[uVar22 + uVar21 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar27 = uVar14 << 6 & (uint)uVar21;
        uVar22 = (ulong)uVar27;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar21 + uVar22 + uVar35];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar29 | uVar13 << 8;
        }
        uVar19 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar30 = uVar13 - uVar19;
        if (uVar13 < uVar19) {
          pUVar16[uVar21 + uVar22 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar22 = (ulong)(uVar27 ^ (uint)uVar21);
          uVar30 = uVar13;
        }
        else {
          uVar19 = uVar18 - uVar19;
          pUVar16[uVar21 + uVar22 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        uVar27 = uVar14 << 7 & (uint)uVar22;
        uVar21 = (ulong)uVar27;
        uVar35 = (ulong)uVar31;
        uVar3 = pUVar16[uVar22 + uVar21 + uVar35];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar30 = (uint)bVar29 | uVar30 << 8;
        }
        uVar23 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar31 = uVar31 * 2;
        uVar18 = uVar30 - uVar23;
        if (uVar30 < uVar23) {
          pUVar16[uVar22 + uVar21 + uVar35] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar27 = uVar27 ^ (uint)uVar22;
          uVar18 = uVar30;
        }
        else {
          uVar23 = uVar19 - uVar23;
          pUVar16[uVar22 + uVar21 + uVar35] = uVar3 - (uVar3 >> 5);
          uVar31 = uVar31 | 1;
        }
        lVar10 = (ulong)(uVar14 << 9 & uVar27 * 2) + (ulong)(uVar27 * 2);
        uVar21 = (ulong)uVar31;
        uVar3 = *(ushort *)((long)pUVar16 + uVar21 * 2 + lVar10);
        if (uVar23 < 0x1000000) {
          uVar23 = uVar23 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar14 = (uVar34 + (uint)(uVar34 < 10) * 3) - 6;
        uVar27 = (uVar23 >> 0xb) * (uint)uVar3;
        bVar29 = (char)uVar31 * '\x02';
        uVar13 = uVar18 - uVar27;
        if (uVar18 < uVar27) {
          *(ushort *)((long)pUVar16 + uVar21 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar18;
        }
        else {
          uVar27 = uVar23 - uVar27;
          *(ushort *)((long)pUVar16 + uVar21 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          bVar29 = bVar29 | 1;
        }
      }
      local_b8 = (ulong)uVar14;
      UVar36 = UVar36 + 1;
      pBVar6[SVar33] = bVar29;
      SVar33 = SVar33 + 1;
      iVar15 = 3;
    }
    else {
      uVar27 = uVar27 - uVar30;
      pUVar5[uVar22 + uVar21] = uVar3 - (uVar3 >> 5);
      if (uVar27 < 0x1000000) {
        uVar27 = uVar27 * 0x100;
        bVar29 = *pbVar25;
        pbVar25 = pbVar25 + 1;
        uVar31 = uVar31 * 0x100 | (uint)bVar29;
      }
      uVar3 = pUVar5[local_b8 + 0xc0];
      uVar30 = (uVar27 >> 0xb) * (uint)uVar3;
      uVar13 = uVar31 - uVar30;
      if (uVar31 < uVar30) {
        pUVar5[local_b8 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
        local_b8 = (ulong)(uVar34 + 0xc);
        puVar24 = pUVar5 + 0x332;
      }
      else {
        uVar27 = uVar27 - uVar30;
        pUVar5[local_b8 + 0xc0] = uVar3 - (uVar3 >> 5);
        if (UVar36 == 0 && uVar4 == 0) {
          iVar15 = 1;
          UVar36 = 0;
          goto LAB_0070fe91;
        }
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 * 0x100;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar29 | uVar13 * 0x100;
        }
        uVar3 = pUVar5[local_b8 + 0xcc];
        uVar30 = (uVar27 >> 0xb) * (uint)uVar3;
        uVar31 = uVar13 - uVar30;
        if (uVar13 < uVar30) {
          pUVar5[local_b8 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
          if (uVar30 < 0x1000000) {
            uVar30 = uVar30 * 0x100;
            bVar29 = *pbVar25;
            pbVar25 = pbVar25 + 1;
            uVar13 = (uint)bVar29 | uVar13 << 8;
          }
          uVar3 = pUVar5[uVar22 + uVar21 + 0xf0];
          uVar27 = (uVar30 >> 0xb) * (uint)uVar3;
          uVar31 = uVar13 - uVar27;
          if (uVar13 < uVar27) {
            pUVar5[uVar22 + uVar21 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
            SVar32 = 0;
            if (SVar33 < local_dc) {
              SVar32 = SVar7;
            }
            pBVar6[SVar33] = pBVar6[SVar32 + (SVar33 - local_dc)];
            SVar33 = SVar33 + 1;
            UVar36 = UVar36 + 1;
            local_b8 = (ulong)((uint)(6 < uVar34) * 2 + 9);
            iVar15 = 3;
            goto LAB_0070fe91;
          }
          uVar30 = uVar30 - uVar27;
          pUVar5[uVar22 + uVar21 + 0xf0] = uVar3 - (uVar3 >> 5);
          uVar18 = local_d0;
        }
        else {
          uVar27 = uVar27 - uVar30;
          pUVar5[local_b8 + 0xcc] = uVar3 - (uVar3 >> 5);
          if (uVar27 < 0x1000000) {
            uVar27 = uVar27 * 0x100;
            bVar29 = *pbVar25;
            pbVar25 = pbVar25 + 1;
            uVar31 = uVar31 * 0x100 | (uint)bVar29;
          }
          uVar3 = pUVar5[local_b8 + 0xd8];
          uVar30 = (uVar27 >> 0xb) * (uint)uVar3;
          uVar13 = uVar31 - uVar30;
          if (uVar31 < uVar30) {
            pUVar5[local_b8 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
            local_dc = local_d0;
          }
          else {
            uVar27 = uVar27 - uVar30;
            pUVar5[local_b8 + 0xd8] = uVar3 - (uVar3 >> 5);
            if (uVar27 < 0x1000000) {
              uVar27 = uVar27 * 0x100;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar13 = uVar13 * 0x100 | (uint)bVar29;
            }
            uVar3 = pUVar5[local_b8 + 0xe4];
            uVar30 = (uVar27 >> 0xb) * (uint)uVar3;
            uVar31 = uVar13 - uVar30;
            if (uVar13 < uVar30) {
              sVar8 = (short)(0x800 - uVar3 >> 5);
              uVar31 = uVar13;
              UVar28 = local_d4;
            }
            else {
              uVar30 = uVar27 - uVar30;
              sVar8 = -(uVar3 >> 5);
              local_cc = local_d4;
            }
            pUVar5[local_b8 + 0xe4] = sVar8 + uVar3;
            local_d4 = local_d0;
            local_dc = UVar28;
          }
        }
        local_b8 = (ulong)(6 < uVar34) * 3 + 8;
        puVar24 = pUVar5 + 0x534;
        local_d0 = uVar18;
      }
      uVar3 = *puVar24;
      if (uVar30 < 0x1000000) {
        uVar30 = uVar30 << 8;
        bVar29 = *pbVar25;
        pbVar25 = pbVar25 + 1;
        uVar31 = uVar31 << 8 | (uint)bVar29;
      }
      uVar27 = (uVar30 >> 0xb) * (uint)uVar3;
      uVar18 = uVar31 - uVar27;
      if (uVar31 < uVar27) {
        *puVar24 = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 * 0x100;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar31 = uVar31 << 8 | (uint)bVar29;
        }
        uVar26 = (ulong)(uVar14 << 3);
        uVar3 = puVar24[uVar26 + 3];
        uVar18 = (uVar27 >> 0xb) * (uint)uVar3;
        uVar13 = uVar31 - uVar18;
        if (uVar31 < uVar18) {
          sVar8 = (short)(0x800 - uVar3 >> 5);
          local_d8 = 2;
          uVar13 = uVar31;
        }
        else {
          uVar18 = uVar27 - uVar18;
          sVar8 = -(uVar3 >> 5);
          local_d8 = 3;
        }
        puVar24[uVar26 + 3] = sVar8 + uVar3;
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = uVar13 << 8 | (uint)bVar29;
        }
        uVar21 = (ulong)local_d8;
        uVar3 = puVar24[uVar26 + uVar21 + 2];
        uVar14 = (uVar18 >> 0xb) * (uint)uVar3;
        local_d8 = local_d8 * 2;
        uVar31 = uVar13 - uVar14;
        if (uVar13 < uVar14) {
          puVar24[uVar26 + uVar21 + 2] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar31 = uVar13;
        }
        else {
          uVar14 = uVar18 - uVar14;
          puVar24[uVar26 + uVar21 + 2] = uVar3 - (uVar3 >> 5);
          local_d8 = local_d8 | 1;
        }
        uVar21 = (ulong)local_d8;
        uVar3 = puVar24[uVar26 + uVar21 + 2];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar31 = uVar31 << 8 | (uint)bVar29;
        }
        uVar27 = (uVar14 >> 0xb) * (uint)uVar3;
        local_d8 = local_d8 * 2;
        uVar13 = uVar31 - uVar27;
        if (uVar31 < uVar27) {
          puVar24[uVar26 + uVar21 + 2] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar31;
        }
        else {
          uVar27 = uVar14 - uVar27;
          puVar24[uVar26 + uVar21 + 2] = uVar3 - (uVar3 >> 5);
          local_d8 = local_d8 | 1;
        }
        local_d8 = local_d8 - 8;
      }
      else {
        uVar30 = uVar30 - uVar27;
        *puVar24 = uVar3 - (uVar3 >> 5);
        if (uVar30 < 0x1000000) {
          uVar30 = uVar30 * 0x100;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = uVar18 * 0x100 | (uint)bVar29;
        }
        uVar3 = puVar24[1];
        uVar27 = (uVar30 >> 0xb) * (uint)uVar3;
        uVar13 = uVar18 - uVar27;
        if (uVar18 < uVar27) {
          puVar24[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
          if (uVar27 < 0x1000000) {
            uVar27 = uVar27 * 0x100;
            bVar29 = *pbVar25;
            pbVar25 = pbVar25 + 1;
            uVar18 = uVar18 << 8 | (uint)bVar29;
          }
          uVar26 = (ulong)(uVar14 << 3);
          uVar3 = puVar24[uVar26 + 0x83];
          uVar31 = (uVar27 >> 0xb) * (uint)uVar3;
          uVar13 = uVar18 - uVar31;
          if (uVar18 < uVar31) {
            sVar8 = (short)(0x800 - uVar3 >> 5);
            local_d8 = 2;
            uVar13 = uVar18;
          }
          else {
            uVar31 = uVar27 - uVar31;
            sVar8 = -(uVar3 >> 5);
            local_d8 = 3;
          }
          puVar24[uVar26 + 0x83] = sVar8 + uVar3;
          if (uVar31 < 0x1000000) {
            uVar31 = uVar31 << 8;
            bVar29 = *pbVar25;
            pbVar25 = pbVar25 + 1;
            uVar13 = uVar13 << 8 | (uint)bVar29;
          }
          uVar21 = (ulong)local_d8;
          uVar3 = puVar24[uVar26 + uVar21 + 0x82];
          uVar14 = (uVar31 >> 0xb) * (uint)uVar3;
          local_d8 = local_d8 * 2;
          uVar18 = uVar13 - uVar14;
          if (uVar13 < uVar14) {
            puVar24[uVar26 + uVar21 + 0x82] = (short)(0x800 - uVar3 >> 5) + uVar3;
            uVar18 = uVar13;
          }
          else {
            uVar14 = uVar31 - uVar14;
            puVar24[uVar26 + uVar21 + 0x82] = uVar3 - (uVar3 >> 5);
            local_d8 = local_d8 | 1;
          }
          uVar21 = (ulong)local_d8;
          uVar3 = puVar24[uVar26 + uVar21 + 0x82];
          if (uVar14 < 0x1000000) {
            uVar14 = uVar14 << 8;
            bVar29 = *pbVar25;
            pbVar25 = pbVar25 + 1;
            uVar18 = (uint)bVar29 | uVar18 << 8;
          }
          uVar27 = (uVar14 >> 0xb) * (uint)uVar3;
          local_d8 = local_d8 * 2;
          uVar13 = uVar18 - uVar27;
          if (uVar18 < uVar27) {
            puVar24[uVar26 + uVar21 + 0x82] = (short)(0x800 - uVar3 >> 5) + uVar3;
            uVar13 = uVar18;
          }
          else {
            uVar27 = uVar14 - uVar27;
            puVar24[uVar26 + uVar21 + 0x82] = uVar3 - (uVar3 >> 5);
            local_d8 = local_d8 | 1;
          }
        }
        else {
          uVar27 = uVar30 - uVar27;
          puVar24[1] = uVar3 - (uVar3 >> 5);
          uVar26 = 1;
          do {
            uVar18 = uVar27;
            uVar31 = uVar13;
            if (uVar27 < 0x1000000) {
              uVar18 = uVar27 << 8;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar31 = uVar13 << 8 | (uint)bVar29;
            }
            uVar3 = puVar24[uVar26 + 0x102];
            uVar27 = (uVar18 >> 0xb) * (uint)uVar3;
            local_d8 = (int)uVar26 * 2;
            uVar13 = uVar31 - uVar27;
            if (uVar31 < uVar27) {
              puVar24[uVar26 + 0x102] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar13 = uVar31;
            }
            else {
              uVar27 = uVar18 - uVar27;
              puVar24[uVar26 + 0x102] = uVar3 - (uVar3 >> 5);
              local_d8 = local_d8 | 1;
            }
            uVar26 = (ulong)local_d8;
          } while (local_d8 < 0x100);
          local_d8 = local_d8 - 0xf0;
        }
      }
      if (0xb < (uint)local_b8) {
        uVar18 = 3;
        if (local_d8 < 3) {
          uVar18 = local_d8;
        }
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar13 = (uint)bVar29 | uVar13 << 8;
        }
        uVar26 = (ulong)(uVar18 << 7);
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 + 0x362);
        uVar31 = (uVar27 >> 0xb) * (uint)uVar3;
        uVar18 = uVar13 - uVar31;
        if (uVar13 < uVar31) {
          sVar8 = (short)(0x800 - uVar3 >> 5);
          uVar14 = 2;
          uVar18 = uVar13;
        }
        else {
          uVar31 = uVar27 - uVar31;
          sVar8 = -(uVar3 >> 5);
          uVar14 = 3;
        }
        lVar10 = uVar26 + 0x360;
        *(ushort *)((long)pUVar5 + uVar26 + 0x362) = sVar8 + uVar3;
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar26 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10);
        uVar13 = (uVar31 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar27 = uVar18 - uVar13;
        if (uVar18 < uVar13) {
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar27 = uVar18;
        }
        else {
          uVar13 = uVar31 - uVar13;
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar26 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10);
        if (uVar13 < 0x1000000) {
          uVar13 = uVar13 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar27 = (uint)bVar29 | uVar27 << 8;
        }
        uVar31 = (uVar13 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar18 = uVar27 - uVar31;
        if (uVar27 < uVar31) {
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar18 = uVar27;
        }
        else {
          uVar31 = uVar13 - uVar31;
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar26 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10);
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar13 = (uVar31 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar27 = uVar18 - uVar13;
        if (uVar18 < uVar13) {
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar27 = uVar18;
        }
        else {
          uVar13 = uVar31 - uVar13;
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar26 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10);
        if (uVar13 < 0x1000000) {
          uVar13 = uVar13 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar27 = (uint)bVar29 | uVar27 << 8;
        }
        uVar31 = (uVar13 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar18 = uVar27 - uVar31;
        if (uVar27 < uVar31) {
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar18 = uVar27;
        }
        else {
          uVar31 = uVar13 - uVar31;
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar26 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10);
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar29 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          uVar18 = (uint)bVar29 | uVar18 << 8;
        }
        uVar27 = (uVar31 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar13 = uVar18 - uVar27;
        if (uVar18 < uVar27) {
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar18;
        }
        else {
          uVar27 = uVar31 - uVar27;
          *(ushort *)((long)pUVar5 + uVar26 * 2 + lVar10) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar18 = uVar14 - 0x40;
        if (uVar18 < 4) {
LAB_0070fe04:
          if (uVar4 == 0) {
            if (uVar18 < UVar36) goto LAB_0070fe19;
LAB_0070fe30:
            p->dicPos = SVar33;
            iVar15 = 1;
          }
          else {
            if (uVar4 <= uVar18) goto LAB_0070fe30;
LAB_0070fe19:
            local_b8 = (ulong)((uint)(0x12 < (uint)local_b8) * 3 + 7);
            iVar15 = 0;
          }
          local_cc = local_d4;
          local_d4 = local_d0;
          local_d0 = local_dc;
          local_dc = uVar18 + 1;
        }
        else {
          uVar31 = uVar14 & 1 | 2;
          if (uVar18 < 0xe) {
            iVar15 = (uVar18 >> 1) - 1;
            uVar22 = (ulong)(uVar31 << ((byte)iVar15 & 0x1f));
            uVar21 = (ulong)uVar18;
            uVar31 = 1;
            uVar14 = 1;
            uVar26 = uVar22;
            do {
              uVar18 = uVar27;
              if (uVar27 < 0x1000000) {
                uVar18 = uVar27 << 8;
                bVar29 = *pbVar25;
                pbVar25 = pbVar25 + 1;
                uVar13 = uVar13 << 8 | (uint)bVar29;
              }
              uVar35 = (ulong)uVar14;
              uVar3 = pUVar5[uVar22 + ((uVar35 + 0x2af) - uVar21)];
              uVar27 = (uVar18 >> 0xb) * (uint)uVar3;
              uVar14 = uVar14 * 2;
              uVar34 = uVar13 - uVar27;
              if (uVar13 < uVar27) {
                pUVar5[uVar22 + ((uVar35 + 0x2af) - uVar21)] = (short)(0x800 - uVar3 >> 5) + uVar3;
              }
              else {
                uVar27 = uVar18 - uVar27;
                pUVar5[uVar22 + ((uVar35 + 0x2af) - uVar21)] = uVar3 - (uVar3 >> 5);
                uVar14 = uVar14 | 1;
                uVar26 = (ulong)((uint)uVar26 | uVar31);
                uVar13 = uVar34;
              }
              uVar18 = (uint)uVar26;
              uVar31 = uVar31 * 2;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            iVar15 = 0;
            bVar9 = true;
          }
          else {
            iVar15 = (uVar18 >> 1) - 5;
            do {
              uVar18 = uVar27;
              if (uVar27 < 0x1000000) {
                bVar29 = *pbVar25;
                pbVar25 = pbVar25 + 1;
                uVar13 = (uint)bVar29 | uVar13 << 8;
                uVar18 = uVar27 << 8;
              }
              uVar27 = uVar18 >> 1;
              uVar14 = (int)(uVar13 - uVar27) >> 0x1f;
              uVar31 = uVar14 + uVar31 * 2 + 1;
              uVar13 = (uVar14 & uVar27) + (uVar13 - uVar27);
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            if (uVar18 < 0x2000000) {
              uVar27 = uVar27 << 8;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar13 = (uint)bVar29 | uVar13 * 0x100;
            }
            uVar18 = uVar31 * 0x10;
            uVar3 = pUVar5[0x323];
            uVar14 = (uVar27 >> 0xb) * (uint)uVar3;
            uVar31 = uVar13 - uVar14;
            if (uVar13 < uVar14) {
              pUVar5[0x323] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar27 = 2;
              uVar31 = uVar13;
            }
            else {
              uVar14 = uVar27 - uVar14;
              pUVar5[0x323] = uVar3 - (uVar3 >> 5);
              uVar18 = uVar18 | 1;
              uVar27 = 3;
            }
            if (uVar14 < 0x1000000) {
              uVar14 = uVar14 << 8;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar31 = (uint)bVar29 | uVar31 << 8;
            }
            uVar3 = pUVar5[(ulong)uVar27 + 0x322];
            uVar30 = (uVar14 >> 0xb) * (uint)uVar3;
            uVar13 = uVar27 * 2;
            uVar34 = uVar31 - uVar30;
            if (uVar31 < uVar30) {
              pUVar5[(ulong)uVar27 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar34 = uVar31;
            }
            else {
              uVar30 = uVar14 - uVar30;
              pUVar5[(ulong)uVar27 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar13 = uVar13 | 1;
              uVar18 = uVar18 | 2;
            }
            uVar3 = pUVar5[(ulong)uVar13 + 0x322];
            if (uVar30 < 0x1000000) {
              uVar30 = uVar30 << 8;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar34 = (uint)bVar29 | uVar34 << 8;
            }
            uVar14 = (uVar30 >> 0xb) * (uint)uVar3;
            uVar27 = uVar13 * 2;
            uVar31 = uVar34 - uVar14;
            if (uVar34 < uVar14) {
              pUVar5[(ulong)uVar13 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar31 = uVar34;
            }
            else {
              uVar14 = uVar30 - uVar14;
              pUVar5[(ulong)uVar13 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar27 = uVar27 | 1;
              uVar18 = uVar18 | 4;
            }
            uVar26 = (ulong)uVar27;
            uVar3 = pUVar5[uVar26 + 0x322];
            if (uVar14 < 0x1000000) {
              uVar14 = uVar14 << 8;
              bVar29 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              uVar31 = (uint)bVar29 | uVar31 << 8;
            }
            uVar27 = (uVar14 >> 0xb) * (uint)uVar3;
            uVar13 = uVar31 - uVar27;
            if (uVar31 < uVar27) {
              pUVar5[uVar26 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar13 = uVar31;
            }
            else {
              uVar27 = uVar14 - uVar27;
              pUVar5[uVar26 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar18 = uVar18 | 8;
            }
            if (uVar18 == 0xffffffff) {
              local_d8 = local_d8 + 0x112;
              local_b8 = (ulong)((uint)local_b8 - 0xc);
              uVar18 = 0xffffffff;
              iVar15 = 2;
              bVar9 = false;
            }
            else {
              iVar15 = 0;
              bVar9 = true;
            }
          }
          if (bVar9) goto LAB_0070fe04;
        }
        uVar26 = (ulong)local_d8;
        if (iVar15 != 0) goto LAB_0070fe91;
      }
      local_d8 = local_d8 + 2;
      uVar26 = (ulong)local_d8;
      uVar21 = local_90 - SVar33;
      if (uVar21 == 0) {
        p->dicPos = SVar33;
        iVar15 = 1;
      }
      else {
        uVar22 = uVar21 & 0xffffffff;
        if (uVar26 <= uVar21) {
          uVar22 = (ulong)local_d8;
        }
        SVar32 = 0;
        if (SVar33 < local_dc) {
          SVar32 = SVar7;
        }
        SVar32 = SVar32 + (SVar33 - local_dc);
        iVar20 = (int)uVar22;
        UVar36 = UVar36 + iVar20;
        if (SVar7 - SVar32 < uVar22) {
          do {
            pBVar6[SVar33] = pBVar6[SVar32];
            SVar33 = SVar33 + 1;
            SVar32 = SVar32 + 1;
            if (SVar32 == SVar7) {
              SVar32 = 0;
            }
            uVar18 = (int)uVar22 - 1;
            uVar22 = (ulong)uVar18;
          } while (uVar18 != 0);
        }
        else {
          pBVar17 = pBVar6 + SVar33;
          uVar26 = uVar22;
          do {
            *pBVar17 = pBVar17[SVar32 - SVar33];
            pBVar17 = pBVar17 + 1;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
          SVar33 = SVar33 + uVar22;
        }
        iVar15 = 0;
        uVar26 = (ulong)(local_d8 - iVar20);
      }
    }
LAB_0070fe91:
    if ((iVar15 == 0) || (iVar15 == 3)) {
      if ((local_90 <= SVar33) || (bufLimit <= pbVar25)) goto LAB_0070ff49;
      goto LAB_0070e8d7;
    }
    if (iVar15 != 2) {
      iVar15 = 1;
      bVar9 = true;
      goto LAB_0070ffc2;
    }
LAB_0070ff49:
    if (uVar27 < 0x1000000) {
      uVar27 = uVar27 << 8;
      bVar2 = *pbVar25;
      pbVar25 = pbVar25 + 1;
      uVar13 = (uint)bVar2 | uVar13 << 8;
    }
    p->buf = pbVar25;
    p->range = uVar27;
    p->code = uVar13;
    p->remainLen = (uint)uVar26;
    p->dicPos = SVar33;
    p->processedPos = UVar36;
    p->reps[0] = local_dc;
    p->reps[1] = local_d0;
    p->reps[2] = local_d4;
    p->reps[3] = local_cc;
    p->state = (uint)local_b8;
    bVar9 = false;
    iVar15 = 0;
LAB_0070ffc2:
    if (bVar9) {
      return iVar15;
    }
    if ((p->checkDicSize == 0) && (uVar4 = (p->prop).dicSize, uVar4 <= p->processedPos)) {
      p->checkDicSize = uVar4;
    }
    LzmaDec_WriteRem(p,limit);
    if (((limit <= p->dicPos) || (bufLimit <= p->buf)) || (0x111 < p->remainLen)) {
      if (0x112 < p->remainLen) {
        p->remainLen = 0x112;
      }
      return 0;
    }
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  do
  {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0)
    {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    
    LzmaDec_WriteRem(p, limit);
  }
  while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart)
    p->remainLen = kMatchSpecLenStart;

  return 0;
}